

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  initializer_list<google::protobuf::compiler::cpp::(anonymous_namespace)::Call> v;
  undefined8 this;
  bool bVar1;
  CppType CVar2;
  char *pcVar3;
  Options *opts_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int __c;
  FieldDescriptor *field_00;
  Getters *__s;
  Arg *in_R8;
  string_view sVar4;
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> in_stack_fffffffffffff188
  ;
  Call *local_e40;
  string_view local_d88;
  string_view local_d78;
  optional<int> local_d68;
  Call local_d60;
  string_view local_d00;
  string_view local_cf0;
  string_view local_ce0;
  optional<int> local_cd0;
  Call local_cc8;
  string_view local_c68;
  string_view local_c58;
  string_view local_c48;
  optional<int> local_c38;
  Call local_c30;
  string_view local_bd0;
  string_view local_bc0;
  string_view local_bb0;
  optional<int> local_ba0;
  Call local_b98;
  string_view local_b38;
  string_view local_b28;
  string_view local_b18;
  optional<int> local_b08;
  Call local_b00;
  string_view local_aa0;
  string_view local_a90;
  string_view local_a80;
  optional<int> local_a70;
  Call local_a68;
  string_view local_a08;
  string_view local_9f8;
  string_view local_9e8;
  optional<int> local_9d8;
  Call local_9d0;
  string_view local_970;
  string_view local_960;
  string_view local_950;
  optional<int> local_940;
  Call local_938;
  string_view local_8d8;
  string_view local_8c8;
  string_view local_8b8;
  optional<int> local_8a8;
  Call local_8a0;
  string_view local_840;
  string_view local_830;
  string_view local_820;
  optional<int> local_810;
  Call local_808;
  string_view local_7a8;
  string_view local_798;
  string_view local_788;
  optional<int> local_778;
  Call local_770;
  Call *local_710;
  Call local_708;
  Call local_6a8;
  Call local_648;
  Call local_5e8;
  Call local_588;
  Call local_528;
  Call local_4c8;
  Call local_468;
  Call local_408;
  Call local_3a8;
  Call local_348;
  undefined1 local_2e8 [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d8;
  string local_2c8;
  Arg local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  string local_268;
  undefined1 local_248 [52];
  int index;
  Getters local_1b8;
  Getters local_158;
  OneofDescriptor *local_f8;
  OneofDescriptor *oneof;
  undefined1 local_80 [8];
  Getters getters;
  Options *opts_local;
  FieldDescriptor *field_local;
  
  __s = (Getters *)field;
  getters.for_flat.field_2._8_8_ = opts;
  anon_unknown_0::Getters::Getters((Getters *)local_80);
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_0::RepeatedFieldGetters
              ((Getters *)&oneof,field,(Options *)getters.for_flat.field_2._8_8_);
    __s = (Getters *)&oneof;
    anon_unknown_0::Getters::operator=((Getters *)local_80,__s);
    anon_unknown_0::Getters::~Getters((Getters *)&oneof);
    __c = extraout_EDX;
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_STRING) {
      local_f8 = FieldDescriptor::real_containing_oneof(field);
      if (local_f8 == (OneofDescriptor *)0x0) {
        anon_unknown_0::StringFieldGetters
                  (&local_1b8,field,(Options *)getters.for_flat.field_2._8_8_);
        __s = &local_1b8;
        anon_unknown_0::Getters::operator=((Getters *)local_80,__s);
        anon_unknown_0::Getters::~Getters(&local_1b8);
        __c = extraout_EDX_01;
      }
      else {
        anon_unknown_0::StringOneofGetters
                  (&local_158,field,local_f8,(Options *)getters.for_flat.field_2._8_8_);
        __s = &local_158;
        anon_unknown_0::Getters::operator=((Getters *)local_80,__s);
        anon_unknown_0::Getters::~Getters(&local_158);
        __c = extraout_EDX_00;
      }
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(field);
      if ((CVar2 != CPPTYPE_MESSAGE) ||
         (bVar1 = IsExplicitLazy(field), __c = extraout_EDX_02, bVar1)) {
        anon_unknown_0::SingularFieldGetters
                  ((Getters *)(local_248 + 0x30),field,(Options *)getters.for_flat.field_2._8_8_);
        __s = (Getters *)(local_248 + 0x30);
        anon_unknown_0::Getters::operator=((Getters *)local_80,__s);
        anon_unknown_0::Getters::~Getters((Getters *)(local_248 + 0x30));
        __c = extraout_EDX_03;
      }
    }
  }
  pcVar3 = FieldDescriptor::index(field,(char *)__s,__c);
  this = getters.for_flat.field_2._8_8_;
  local_248._44_4_ = SUB84(pcVar3,0);
  opts_00 = (Options *)FieldDescriptor::containing_type(field);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_278,"$0_AccessedNoStrip = true;");
  FieldName_abi_cxx11_(&local_2c8,(cpp *)field,field_00);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_2a8,&local_2c8);
  sVar4._M_str = (char *)&local_2a8;
  sVar4._M_len = (size_t)local_278._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_268,(lts_20250127 *)local_278._M_len,sVar4,in_R8)
  ;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_248,&local_268);
  local_710 = &local_708;
  std::optional<int>::optional<int_&,_true>(&local_778,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_788,"get");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_798,"OnGet");
  anon_unknown_0::Call::Call(&local_770,local_778,local_788,local_798);
  local_7a8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
  anon_unknown_0::Call::Arg<>(&local_708,&local_770,local_7a8);
  local_710 = &local_6a8;
  std::optional<int>::optional<int_&,_true>(&local_810,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_820,"set");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_830,"OnSet");
  anon_unknown_0::Call::Call(&local_808,local_810,local_820,local_830);
  local_840 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
  anon_unknown_0::Call::Arg<>(&local_6a8,&local_808,local_840);
  local_710 = &local_648;
  std::optional<int>::optional<int_&,_true>(&local_8a8,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_8b8,"has");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_8c8,"OnHas");
  anon_unknown_0::Call::Call(&local_8a0,local_8a8,local_8b8,local_8c8);
  local_8d8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
  anon_unknown_0::Call::Arg<>(&local_648,&local_8a0,local_8d8);
  local_710 = &local_5e8;
  std::optional<int>::optional<int_&,_true>(&local_940,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_950,"mutable");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_960,"OnMutable");
  anon_unknown_0::Call::Call(&local_938,local_940,local_950,local_960);
  local_970 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
  anon_unknown_0::Call::Arg<>(&local_5e8,&local_938,local_970);
  local_710 = &local_588;
  std::optional<int>::optional<int_&,_true>(&local_9d8,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9e8,"release");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9f8,"OnRelease");
  anon_unknown_0::Call::Call(&local_9d0,local_9d8,local_9e8,local_9f8);
  local_a08 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
  anon_unknown_0::Call::Arg<>(&local_588,&local_9d0,local_a08);
  local_710 = &local_528;
  std::optional<int>::optional<int_&,_true>(&local_a70,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a80,"clear");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a90,"OnClear");
  anon_unknown_0::Call::Call(&local_a68,local_a70,local_a80,local_a90);
  local_aa0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(getters.for_last.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_528,&local_a68,local_aa0);
  local_710 = &local_4c8;
  std::optional<int>::optional<int_&,_true>(&local_b08,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b18,"size");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b28,"OnSize");
  anon_unknown_0::Call::Call(&local_b00,local_b08,local_b18,local_b28);
  local_b38 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(getters.for_last.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_4c8,&local_b00,local_b38);
  local_710 = &local_468;
  std::optional<int>::optional<int_&,_true>(&local_ba0,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bb0,"list");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bc0,"OnList");
  anon_unknown_0::Call::Call(&local_b98,local_ba0,local_bb0,local_bc0);
  local_bd0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(getters.for_last.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_468,&local_b98,local_bd0);
  local_710 = &local_408;
  std::optional<int>::optional<int_&,_true>(&local_c38,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c48,"mutable_list");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c58,"OnMutableList");
  anon_unknown_0::Call::Call(&local_c30,local_c38,local_c48,local_c58);
  local_c68 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(getters.for_last.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_408,&local_c30,local_c68);
  local_710 = &local_3a8;
  std::optional<int>::optional<int_&,_true>(&local_cd0,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_ce0,"add");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_cf0,"OnAdd");
  anon_unknown_0::Call::Call(&local_cc8,local_cd0,local_ce0,local_cf0);
  local_d00 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(getters.base.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_3a8,&local_cc8,local_d00);
  local_710 = &local_348;
  std::optional<int>::optional<int_&,_true>(&local_d68,(int *)(local_248 + 0x2c));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d78,"add_mutable")
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d88,"OnAddMutable");
  anon_unknown_0::Call::Call(&local_d60,local_d68,local_d78,local_d88);
  sVar4 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(getters.base.field_2._M_local_buf + 8));
  anon_unknown_0::Call::Arg<>(&local_348,&local_d60,sVar4);
  local_2e8._0_8_ = &local_708;
  local_2e8._8_8_ = (char *)0xb;
  v._M_len = 0xb;
  v._M_array = (iterator)local_2e8._0_8_;
  absl::lts_20250127::Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const>::
  Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const,google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const>
            ((Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const> *)&local_2d8,
             v);
  anon_unknown_0::GenerateTrackerCalls
            (__return_storage_ptr__,(anon_unknown_0 *)this,opts_00,(Descriptor *)local_248,local_2d8
             ,in_stack_fffffffffffff188);
  local_e40 = (Call *)local_2e8;
  do {
    local_e40 = local_e40 + -1;
    anon_unknown_0::Call::~Call(local_e40);
  } while (local_e40 != &local_708);
  anon_unknown_0::Call::~Call(&local_d60);
  anon_unknown_0::Call::~Call(&local_cc8);
  anon_unknown_0::Call::~Call(&local_c30);
  anon_unknown_0::Call::~Call(&local_b98);
  anon_unknown_0::Call::~Call(&local_b00);
  anon_unknown_0::Call::~Call(&local_a68);
  anon_unknown_0::Call::~Call(&local_9d0);
  anon_unknown_0::Call::~Call(&local_938);
  anon_unknown_0::Call::~Call(&local_8a0);
  anon_unknown_0::Call::~Call(&local_808);
  anon_unknown_0::Call::~Call(&local_770);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2c8);
  anon_unknown_0::Getters::~Getters((Getters *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const FieldDescriptor* field,
                                  const Options& opts) {
  Getters getters;
  if (field->is_repeated()) {
    getters = RepeatedFieldGetters(field, opts);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    const auto* oneof = field->real_containing_oneof();
    if (oneof != nullptr) {
      getters = StringOneofGetters(field, oneof, opts);
    } else {
      getters = StringFieldGetters(field, opts);
    }
  } else if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE ||
             IsExplicitLazy(field)) {
    getters = SingularFieldGetters(field, opts);
  }

  auto index = field->index();
  return GenerateTrackerCalls(
      opts, field->containing_type(),
      absl::Substitute("$0_AccessedNoStrip = true;", FieldName(field)),
      {
          Call(index, "get", "OnGet").Arg(getters.base),
          Call(index, "set", "OnSet").Arg(getters.base),
          Call(index, "has", "OnHas").Arg(getters.base),
          Call(index, "mutable", "OnMutable").Arg(getters.base),
          Call(index, "release", "OnRelease").Arg(getters.base),
          Call(index, "clear", "OnClear").Arg(getters.for_flat),
          Call(index, "size", "OnSize").Arg(getters.for_flat),
          Call(index, "list", "OnList").Arg(getters.for_flat),
          Call(index, "mutable_list", "OnMutableList").Arg(getters.for_flat),
          Call(index, "add", "OnAdd").Arg(getters.for_last),
          Call(index, "add_mutable", "OnAddMutable").Arg(getters.for_last),
      });
}